

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializationLayer.cpp
# Opt level: O2

Event __thiscall SerializationLayer::deserialize_abi_cxx11_(SerializationLayer *this)

{
  char *b_00;
  json_value extraout_RDX;
  long in_RSI;
  Event EVar1;
  input_adapter local_a0;
  Buffer b;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_78;
  _Any_data local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)this,(nullptr_t)0x0);
  SynchronizedQueue<Buffer>::get(&b,(SynchronizedQueue<Buffer> *)(in_RSI + 8));
  b_00 = Buffer::getData(&b);
  nlohmann::detail::input_adapter::input_adapter<const_char_*,_0>(&local_a0,b_00);
  local_58 = 0;
  uStack_50 = 0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse(&local_78,&local_a0,(parser_callback_t *)&local_68,true);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               *)this,&local_78);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a0.ia.
              super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&b);
  EVar1.m_value.object = extraout_RDX.object;
  EVar1._0_8_ = this;
  return EVar1;
}

Assistant:

Event SerializationLayer::deserialize() {
    Event e;

    while(true){
        try{
            Buffer b = packetQueue.get();
            e = Event::parse(b.getData());

            return e;
        }
        catch(...){
            throw EventNotValid("Malformed payload");
        }
    }
}